

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_hadamard_lp_8x8_dual_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 0x10) {
    hadamard_lp_8x8_sse2((int16_t *)((long)src_diff + lVar1),src_stride,coeff);
    coeff = coeff + 0x40;
  }
  return;
}

Assistant:

void aom_hadamard_lp_8x8_dual_sse2(const int16_t *src_diff,
                                   ptrdiff_t src_stride, int16_t *coeff) {
  for (int i = 0; i < 2; i++) {
    hadamard_lp_8x8_sse2(src_diff + (i * 8), src_stride, coeff + (i * 64));
  }
}